

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeccakP-1600-reference.c
# Opt level: O2

void KeccakP1600Round(tKeccakLane *state,uint indexRound)

{
  ulong uVar1;
  long lVar2;
  uint *puVar3;
  ulong *puVar4;
  uint uVar5;
  tKeccakLane *ptVar6;
  uint x;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong auStack_128 [6];
  ulong local_f8 [15];
  tKeccakLane D [5];
  tKeccakLane C [5];
  
  ptVar6 = state;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    uVar10 = 0;
    for (lVar7 = -200; lVar7 != 0; lVar7 = lVar7 + 0x28) {
      uVar10 = uVar10 ^ *(ulong *)((long)ptVar6 + lVar7 + 200);
    }
    local_f8[lVar2] = uVar10;
    ptVar6 = ptVar6 + 1;
  }
  lVar2 = 0;
  while (lVar2 != 5) {
    lVar7 = lVar2 + 1;
    lVar11 = 0;
    if (lVar7 != 5) {
      lVar11 = lVar7;
    }
    uVar10 = (ulong)((int)lVar2 - 1);
    if (lVar7 == 1) {
      uVar10 = 4;
    }
    auStack_128[lVar2] =
         (local_f8[lVar11] << 1 | (ulong)((long)local_f8[lVar11] < 0)) ^ local_f8[uVar10];
    lVar2 = lVar7;
  }
  ptVar6 = state;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    uVar10 = auStack_128[lVar2];
    for (lVar7 = 0; lVar7 != 200; lVar7 = lVar7 + 0x28) {
      *(ulong *)((long)ptVar6 + lVar7) = *(ulong *)((long)ptVar6 + lVar7) ^ uVar10;
    }
    ptVar6 = ptVar6 + 1;
  }
  puVar3 = KeccakRhoOffsets;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    lVar13 = 0;
    lVar7 = lVar2;
    for (lVar11 = 0; lVar11 != 0x19; lVar11 = lVar11 + 5) {
      if ((int)lVar11 == 0 && (int)lVar2 == 0) {
        uVar10 = state[lVar11];
        lVar15 = lVar7;
      }
      else {
        uVar10 = state[lVar7] >> (-(byte)puVar3[lVar11] & 0x3f) ^
                 state[lVar7] << ((byte)puVar3[lVar11] & 0x3f);
        lVar15 = lVar13 * 5 + lVar2;
      }
      state[lVar15] = uVar10;
      lVar13 = lVar13 + 1;
      lVar7 = lVar7 + 5;
    }
    puVar3 = puVar3 + 1;
  }
  puVar4 = local_f8;
  ptVar6 = state;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    for (lVar7 = 0; lVar7 != 200; lVar7 = lVar7 + 0x28) {
      *(undefined8 *)((long)puVar4 + lVar7) = *(undefined8 *)((long)ptVar6 + lVar7);
    }
    puVar4 = puVar4 + 1;
    ptVar6 = ptVar6 + 1;
  }
  uVar12 = 0;
  puVar4 = local_f8;
  iVar8 = 0;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    ptVar6 = state;
    iVar9 = iVar8;
    uVar5 = uVar12;
    for (lVar7 = 0; lVar7 != 0x19; lVar7 = lVar7 + 5) {
      ptVar6[iVar9 + (uVar5 / 5) * -0x19] = puVar4[lVar7];
      ptVar6 = ptVar6 + 1;
      iVar9 = iVar9 + 0xf;
      uVar5 = uVar5 + 3;
    }
    iVar8 = iVar8 + 10;
    uVar12 = uVar12 + 2;
    puVar4 = puVar4 + 1;
  }
  iVar8 = 0;
  ptVar6 = state;
  for (uVar10 = 0; uVar10 != 5; uVar10 = uVar10 + 1) {
    uVar16 = 0;
    while (uVar16 != 5) {
      uVar1 = uVar16 + 1;
      uVar14 = 0;
      if (uVar1 != 5) {
        uVar14 = uVar1;
      }
      iVar9 = 2;
      if (2 < uVar16) {
        iVar9 = -3;
      }
      local_f8[uVar16] =
           ~state[uVar10 * 5 + uVar14] & state[(uint)(iVar9 + (int)uVar16 + iVar8)] ^ ptVar6[uVar16]
      ;
      uVar16 = uVar1;
    }
    for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
      state[(ulong)(uint)(iVar8 + (int)((uVar10 & 0xffffffff) / 5) * -0x19) + lVar2] =
           local_f8[lVar2];
    }
    iVar8 = iVar8 + 5;
    ptVar6 = ptVar6 + 5;
  }
  *state = *state ^ KeccakRoundConstants[indexRound];
  return;
}

Assistant:

void KeccakP1600Round(tKeccakLane *state, unsigned int indexRound)
{
#ifdef KeccakReference
    displayRoundNumber(3, indexRound);
#endif

    theta(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After theta", state, 1600);
#endif

    rho(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After rho", state, 1600);
#endif

    pi(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After pi", state, 1600);
#endif

    chi(state);
#ifdef KeccakReference
    displayStateAsLanes(3, "After chi", state, 1600);
#endif

    iota(state, indexRound);
#ifdef KeccakReference
    displayStateAsLanes(3, "After iota", state, 1600);
#endif
}